

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::argument_decl_abi_cxx11_(CompilerGLSL *this,Parameter *arg)

{
  char *pcVar1;
  uint32_t uVar2;
  SPIRType *in_RDX;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  char *local_30;
  char *direction;
  SPIRType *type;
  Parameter *arg_local;
  CompilerGLSL *this_local;
  
  type = in_RDX;
  arg_local = arg;
  this_local = this;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(in_RDX->super_IVariant)._vptr_IVariant + 4));
  direction = (char *)Compiler::expression_type((Compiler *)arg,uVar2);
  local_30 = "";
  if ((((SPIRType *)direction)->pointer & 1U) != 0) {
    if ((*(int *)&(type->super_IVariant).field_0xc == 0) || ((type->super_IVariant).self.id == 0)) {
      if (*(int *)&(type->super_IVariant).field_0xc != 0) {
        local_30 = "out ";
      }
    }
    else {
      local_30 = "inout ";
    }
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (**(code **)(*(long *)arg + 0x188))(local_50,arg,uVar2);
  pcVar1 = direction;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (**(code **)(*(long *)arg + 0x30))(local_90,arg,uVar2,1);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
  (**(code **)(*(long *)arg + 0xd8))(local_70,arg,pcVar1,local_90,uVar2);
  join<char_const*&,std::__cxx11::string,std::__cxx11::string>
            ((spirv_cross *)this,&local_30,local_50,local_70);
  ::std::__cxx11::string::~string((string *)local_70);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

string CompilerGLSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	// glslangValidator seems to make all arguments pointer no matter what which is rather bizarre ...
	auto &type = expression_type(arg.id);
	const char *direction = "";

	if (type.pointer)
	{
		if (arg.write_count && arg.read_count)
			direction = "inout ";
		else if (arg.write_count)
			direction = "out ";
	}

	return join(direction, to_qualifiers_glsl(arg.id), variable_decl(type, to_name(arg.id), arg.id));
}